

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::_::
CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Question,_capnp::_::RpcSystemBase::RpcConnectionState::Question_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  uint *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Question *pQVar4;
  
  pQVar4 = this->pos;
  if (this->start < pQVar4) {
    do {
      this->pos = pQVar4 + -1;
      puVar1 = pQVar4[-1].paramExports.ptr;
      if (puVar1 != (uint *)0x0) {
        sVar2 = pQVar4[-1].paramExports.size_;
        pQVar4[-1].paramExports.ptr = (uint *)0x0;
        pQVar4[-1].paramExports.size_ = 0;
        pAVar3 = pQVar4[-1].paramExports.disposer;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,4,sVar2,sVar2,0);
      }
      pQVar4 = this->pos;
    } while (this->start < pQVar4);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }